

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_platform.cpp
# Opt level: O3

int vsprintf_s(char *buffer,size_t sizeOfBuffer,char *format,__va_list_tag *args)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (sizeOfBuffer != 0) {
    iVar1 = vsnprintf(buffer,sizeOfBuffer,format,args);
    buffer[sizeOfBuffer - 1] = '\0';
    iVar3 = (int)sizeOfBuffer + -1;
    if (iVar1 < iVar3) {
      iVar3 = iVar1;
    }
    iVar2 = (int)sizeOfBuffer + -1;
    if (-1 < iVar1) {
      iVar2 = iVar3;
    }
    return iVar2;
  }
  return 0;
}

Assistant:

int vsprintf_s(char* buffer, size_t sizeOfBuffer, const char* format, va_list args)
{
    if (!sizeOfBuffer)
    {
        return 0;
    }

    int c = vsnprintf(buffer, sizeOfBuffer, format, args);

    buffer[sizeOfBuffer - 1] = '\0';

    if (c < 0)
    {
        return sizeOfBuffer - 1;
    }

    return CRNLIB_MIN(c, (int)sizeOfBuffer - 1);
}